

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

int __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::copy
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Hdr *pHVar1;
  bool bVar2;
  int iVar3;
  Ptr<void> shadow;
  Ptr<void> local_38;
  EVP_PKEY_CTX *pEVar4;
  
  if (src == (EVP_PKEY_CTX *)0x0) {
    iVar3 = 0;
    setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(this,0);
  }
  else {
    local_38.m_p = (void *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    pHVar1 = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_hdr;
    if (((pHVar1 == (Hdr *)0x0) || (dst < pHVar1 + 1)) ||
       ((EVP_PKEY_CTX *)((long)&pHVar1[1].super_RefCount._vptr_RefCount + pHVar1->m_bufferSize) <=
        dst)) {
      bVar2 = setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(this,(size_t)src);
      pEVar4 = (EVP_PKEY_CTX *)0xffffffffffffffff;
      if (bVar2) {
        memmove((this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p,dst,(size_t)src);
        pEVar4 = src;
      }
    }
    else {
      (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p = (char *)dst;
      (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count = (size_t)src;
      pEVar4 = src;
    }
    iVar3 = (int)pEVar4;
    rc::Ptr<void>::clear(&local_38);
  }
  return iVar3;
}

Assistant:

size_t
	copy(
		const T* p,
		size_t count
	) {
		if (count == 0) {
			clear();
			return 0;
		}

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			if (Details::IsSimple) {
				// for simple non-ctor-dtor types we can apply in-buffer shift

				T* end = (T*)this->m_hdr->getEnd();
				ASSERT(p + count <= end);

				this->m_p = (T*)p;
				this->m_count = count;
				return count;
			} else {
				shadow = this->m_hdr; // ensure we keep p intact
			}

		bool result = setCount(count);
		if (!result)
			return -1;

		Details::copy(this->m_p, p, count);
		return count;
	}